

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

void __thiscall
duckdb::LocalTableStorage::LocalTableStorage
          (LocalTableStorage *this,ClientContext *context,DataTable *new_dt,
          LocalTableStorage *parent,ColumnDefinition *new_column,
          ExpressionExecutor *default_executor)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Allocator *pAVar5;
  ClientContext *context_00;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  __atomic_base<unsigned_long> local_38;
  
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->table_ref)._M_data = new_dt;
  local_38._M_i = (__int_type)default_executor;
  pAVar5 = Allocator::Get(new_dt->db);
  this->allocator = pAVar5;
  switchD_005700f1::default(&this->row_groups,0,0x91);
  this->deleted_rows = parent->deleted_rows;
  puVar2 = (parent->optimistic_collections).
           super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parent->optimistic_collections).
       super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parent->optimistic_collections).
       super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OptimisticDataWriter::OptimisticDataWriter
            (&this->optimistic_writer,new_dt,&parent->optimistic_writer);
  this->merged_storage = parent->merged_storage;
  this->is_dropped = false;
  (this->collections_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  context_00 = (ClientContext *)
               shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&parent->row_groups);
  RowGroupCollection::AddColumn
            ((RowGroupCollection *)&stack0xffffffffffffffb8,context_00,(ColumnDefinition *)context,
             (ExpressionExecutor *)new_column);
  p_Var4 = p_Stack_40;
  peVar3 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  p_Var1 = (parent->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (parent->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (parent->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ::_M_move_assign(&(this->append_indexes).indexes.
                    super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ,&(parent->append_indexes).indexes);
  return;
}

Assistant:

LocalTableStorage::LocalTableStorage(ClientContext &context, DataTable &new_dt, LocalTableStorage &parent,
                                     ColumnDefinition &new_column, ExpressionExecutor &default_executor)
    : table_ref(new_dt), allocator(Allocator::Get(new_dt.db)), deleted_rows(parent.deleted_rows),
      optimistic_collections(std::move(parent.optimistic_collections)),
      optimistic_writer(new_dt, parent.optimistic_writer), merged_storage(parent.merged_storage) {

	row_groups = parent.row_groups->AddColumn(context, new_column, default_executor);
	parent.row_groups.reset();
	append_indexes.Move(parent.append_indexes);
}